

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

FloorLayerParams * __thiscall
CoreML::Specification::FloorLayerParams::New(FloorLayerParams *this,Arena *arena)

{
  FloorLayerParams *this_00;
  FloorLayerParams *n;
  Arena *arena_local;
  FloorLayerParams *this_local;
  
  this_00 = (FloorLayerParams *)operator_new(0x18);
  FloorLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::FloorLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

FloorLayerParams* FloorLayerParams::New(::google::protobuf::Arena* arena) const {
  FloorLayerParams* n = new FloorLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}